

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAux.h
# Opt level: O3

void Assimp::LogFunctions<Assimp::XGLImporter>::ThrowException(string *msg)

{
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_38,"XGL: ",msg);
  std::runtime_error::runtime_error(this,(string *)&bStack_38);
  *(undefined ***)this = &PTR__runtime_error_008bf448;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void ThrowException(const std::string& msg)
    {
        throw DeadlyImportError(Prefix()+msg);
    }